

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void OnSetComponentLifecycle(ecs_iter_t *it)

{
  ecs_world_t *world;
  EcsComponentLifecycle *lifecycle;
  long lVar1;
  
  lifecycle = (EcsComponentLifecycle *)ecs_column_w_size(it,0x28,1);
  if (0 < it->count) {
    world = it->world;
    lVar1 = 0;
    do {
      ecs_set_component_actions_w_entity(world,it->entities[lVar1],lifecycle);
      lVar1 = lVar1 + 1;
      lifecycle = lifecycle + 1;
    } while (lVar1 < it->count);
  }
  return;
}

Assistant:

static
void OnSetComponentLifecycle(
    ecs_iter_t *it)
{
    EcsComponentLifecycle *cl = ecs_column(it, EcsComponentLifecycle, 1);
    ecs_world_t *world = it->world;

    int i;
    for (i = 0; i < it->count; i ++) {
        ecs_entity_t e = it->entities[i];
        ecs_set_component_actions_w_entity(world, e, &cl[i]);   
    }
}